

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

int TestBuildFile(ICompilerLogger *pLog,RuntimeObjectSystem *pRTObjSys,Path *file,
                 ITestBuildNotifier *callback,bool bTestFileTracking)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  undefined4 extraout_var;
  char *pcStack_b0;
  int numCurrLoadedModules;
  undefined1 local_a8 [8];
  AUDynArray<const_char_*> filelist;
  int local_80;
  int i;
  undefined1 local_70 [8];
  Path directory;
  filetime_t oldModTime;
  filetime_t currTime;
  int numErrors;
  bool bTestFileTracking_local;
  ITestBuildNotifier *callback_local;
  Path *file_local;
  RuntimeObjectSystem *pRTObjSys_local;
  ICompilerLogger *pLog_local;
  
  if (callback == (ITestBuildNotifier *)0x0) {
    __assert_fail("callback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/RuntimeObjectSystem.cpp"
                  ,0x380,
                  "int TestBuildFile(ICompilerLogger *, RuntimeObjectSystem *, const Path &, ITestBuildNotifier *, bool)"
                 );
  }
  if (pLog != (ICompilerLogger *)0x0) {
    pcVar5 = FileSystemUtils::Path::c_str(file);
    (**(code **)(*(long *)pLog + 0x10))(pLog,"Testing change to file: %s\n",pcVar5);
  }
  bVar1 = FileSystemUtils::Path::Exists(file);
  if (bVar1) {
    if (bTestFileTracking) {
      oldModTime = FileSystemUtils::GetCurrentTime();
      directory.m_string.field_2._8_8_ = FileSystemUtils::Path::GetLastWriteTime(file);
      if (oldModTime == directory.m_string.field_2._8_8_) {
        oldModTime = oldModTime + 1;
      }
      FileSystemUtils::Path::SetLastWriteTime(file,oldModTime);
      FileSystemUtils::Path::ParentPath((Path *)local_70,file);
      FileSystemUtils::Path::SetLastWriteTime((Path *)local_70,oldModTime);
      for (local_80 = 0; local_80 < 0x32; local_80 = local_80 + 1) {
        iVar2 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[0xb])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))(0x3f800000);
        uVar4 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                  _vptr_ITestBuildNotifier[5])();
        if ((uVar4 & 1) != 0) break;
        uVar4 = (*callback->_vptr_ITestBuildNotifier[3])();
        if ((uVar4 & 1) == 0) {
          pLog_local._4_4_ = -0xd1e;
          filelist.super_IAUDynArray<const_char_*>.m_vec.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          goto LAB_00128b47;
        }
      }
      filelist.super_IAUDynArray<const_char_*>.m_vec.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_00128b47:
      FileSystemUtils::Path::~Path((Path *)local_70);
      if (filelist.super_IAUDynArray<const_char_*>.m_vec.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        return pLog_local._4_4_;
      }
    }
    else {
      AUDynArray<const_char_*>::AUDynArray((AUDynArray<const_char_*> *)local_a8,0);
      pcStack_b0 = FileSystemUtils::Path::c_str(file);
      AUDynArray<const_char_*>::Add((AUDynArray<const_char_*> *)local_a8,&stack0xffffffffffffff50);
      (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier._vptr_ITestBuildNotifier
        [0x25])(pRTObjSys,local_a8);
      AUDynArray<const_char_*>::~AUDynArray((AUDynArray<const_char_*> *)local_a8);
    }
    uVar4 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
              _vptr_ITestBuildNotifier[5])();
    if ((uVar4 & 1) == 0) {
      pcVar5 = FileSystemUtils::Path::c_str(file);
      uVar4 = (*callback->_vptr_ITestBuildNotifier[2])(callback,pcVar5,3);
      if ((uVar4 & 1) == 0) {
        return -1;
      }
    }
    else {
      while (iVar2 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                       _vptr_ITestBuildNotifier[6])(), (((byte)iVar2 ^ 0xff) & 1) != 0) {
        uVar4 = (*callback->_vptr_ITestBuildNotifier[3])();
        if ((uVar4 & 1) == 0) {
          return -0xd1e;
        }
      }
      iVar2 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[9])();
      uVar4 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[7])();
      if ((uVar4 & 1) != 0) {
        pcVar5 = FileSystemUtils::Path::c_str(file);
        uVar4 = (*callback->_vptr_ITestBuildNotifier[2])(callback,pcVar5,0);
        if ((uVar4 & 1) == 0) {
          return -0xd1e;
        }
        return 0;
      }
      iVar3 = (*(pRTObjSys->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
                _vptr_ITestBuildNotifier[9])();
      if (iVar3 == iVar2) {
        pcVar5 = FileSystemUtils::Path::c_str(file);
        uVar4 = (*callback->_vptr_ITestBuildNotifier[2])(callback,pcVar5,4);
        if ((uVar4 & 1) == 0) {
          return -1;
        }
      }
      else {
        pcVar5 = FileSystemUtils::Path::c_str(file);
        uVar4 = (*callback->_vptr_ITestBuildNotifier[2])(callback,pcVar5,5);
        if ((uVar4 & 1) == 0) {
          return -1;
        }
      }
    }
  }
  else {
    pcVar5 = FileSystemUtils::Path::c_str(file);
    uVar4 = (*callback->_vptr_ITestBuildNotifier[2])(callback,pcVar5,2);
    if ((uVar4 & 1) == 0) {
      return -1;
    }
  }
  return 1;
}

Assistant:

static int TestBuildFile( ICompilerLogger* pLog, RuntimeObjectSystem* pRTObjSys, const Path& file,
                          ITestBuildNotifier* callback, bool bTestFileTracking )
{
    assert( callback );

    if( pLog ) { pLog->LogInfo("Testing change to file: %s\n", file.c_str()); }

    int numErrors = 0;
    if( file.Exists() )
    {
        if( bTestFileTracking )
        {
            FileSystemUtils::filetime_t currTime = FileSystemUtils::GetCurrentTime();
            FileSystemUtils::filetime_t oldModTime = file.GetLastWriteTime();
            if( currTime == oldModTime )
            {
                // some files may be auto-generated by the program, so may have just been created so won't
                // get a time change unless we force it.
                currTime += 1;
            }
            file.SetLastWriteTime( currTime );
            // we must also change the directories time, as some of our watchers watch the dir
            Path directory = file.ParentPath();
            directory.SetLastWriteTime( currTime );
            for( int i=0; i<50; ++i )
            {
                // wait up to 100 seconds (make configurable?)
                pRTObjSys->GetFileChangeNotifier()->Update( 1.0f ); // force update by using very large time delta
                if( pRTObjSys->GetIsCompiling() ) { break; }
                if( !callback->TestBuildWaitAndUpdate() )
                {
                    return -0xD1E;
                }
            }
        }
        else
        {
            AUDynArray<const char*> filelist;
            filelist.Add( file.c_str() );
            pRTObjSys->OnFileChange( filelist );
        }
        if( pRTObjSys->GetIsCompiling() )
        {
            while( !pRTObjSys->GetIsCompiledComplete() )
            {
                if( !callback->TestBuildWaitAndUpdate() )
                {
                    return -0xD1E;
                }
            }
            int numCurrLoadedModules = pRTObjSys->GetNumberLoadedModules();
            if( pRTObjSys->LoadCompiledModule() )
            {
                if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_SUCCESS ) ) { return -0xD1E; }
                return 0;
            }
            else
            {
                ++numErrors;
                if( (int)pRTObjSys->GetNumberLoadedModules() == numCurrLoadedModules )
                {
                    if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_FAILED ) ) { return -numErrors; }
                }
                else
                {
                    // loaded the module but some other issue
                    if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_OBJECT_SWAP_FAIL ) ) { return -numErrors; }
                }
            }
        }
        else
        {
            ++numErrors;
           if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_NOT_STARTED ) ) { return -numErrors; }
        }
    }
    else
    {
        ++numErrors;
        if( !callback->TestBuildCallback( file.c_str(), TESTBUILDRRESULT_BUILD_FILE_GONE ) ) { return -numErrors; }
    }
    return numErrors;
}